

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelIdentifier.cpp
# Opt level: O0

void __thiscall csm::MIC::Data::setValue(Data *this,string *value,bool clearPrevious)

{
  size_t sVar1;
  char *pcVar2;
  char *__src;
  bool clearPrevious_local;
  string *value_local;
  Data *this_local;
  
  if (clearPrevious) {
    clear(this);
  }
  this->theType = STRING_TYPE;
  (this->field_1).field_0.theStr = (char *)0x0;
  sVar1 = std::__cxx11::string::length();
  (this->field_1).field_0.theLen = sVar1;
  if ((this->field_1).field_0.theLen != 0) {
    pcVar2 = (char *)operator_new__((this->field_1).field_0.theLen + 1);
    (this->field_1).field_0.theStr = pcVar2;
    pcVar2 = (this->field_1).field_0.theStr;
    __src = (char *)std::__cxx11::string::c_str();
    strncpy(pcVar2,__src,(this->field_1).field_0.theLen);
    (this->field_1).field_0.theStr[(this->field_1).field_0.theLen] = '\0';
  }
  return;
}

Assistant:

void Data::setValue(const std::string& value,bool clearPrevious)
{
   if (clearPrevious) clear();
   
   theType = STRING_TYPE;
   theStr  = 0;
   theLen  = value.length();
   
   if (theLen)
   {
      theStr = new char[theLen + 1];
      strncpy(theStr,value.c_str(), theLen);
      theStr[theLen] = '\0';
   }
}